

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlaceTiles.cpp
# Opt level: O0

void __thiscall commands::PlaceTiles::undo(PlaceTiles *this)

{
  size_t in_RDI;
  size_t i;
  Vector2i *in_stack_ffffffffffffffa8;
  Board *this_00;
  PlaceTiles *in_stack_ffffffffffffffc0;
  Tile *in_stack_ffffffffffffffd8;
  Tile *in_stack_ffffffffffffffe0;
  undefined8 local_10;
  
  for (local_10 = *(long *)(in_RDI + 0x50); local_10 != 0; local_10 = local_10 + -1) {
    accessTile(in_stack_ffffffffffffffc0,in_RDI);
    this_00 = *(Board **)(in_RDI + 0x10);
    std::vector<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>::operator[]
              ((vector<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_> *)(in_RDI + 0x38),
               local_10 - 1);
    Board::accessTile(this_00,in_stack_ffffffffffffffa8);
    Tile::swapWith(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  *(undefined8 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

void PlaceTiles::undo() {
    for (size_t i = lastExecuteSize_; i > 0; --i) {
        accessTile(i - 1).swapWith(board_.accessTile(tilePositions_[i - 1]));
    }
    lastExecuteSize_ = 0;
}